

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffers_1
asio::buffer<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  const_buffers_1 *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  void *in_stack_ffffffffffffffd8;
  undefined1 local_10 [16];
  
  this = (const_buffers_1 *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x490783);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
  const_buffers_1::const_buffers_1(this,in_stack_ffffffffffffffd8,0x4907a4);
  return (const_buffers_1)(const_buffer)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_CONST_BUFFER buffer(
    const std::basic_string<Elem, Traits, Allocator>& data) noexcept
{
  return ASIO_CONST_BUFFER(data.data(), data.size() * sizeof(Elem)
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , detail::buffer_debug_check<
          typename std::basic_string<Elem, Traits, Allocator>::const_iterator
        >(data.begin())
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}